

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Bond * __thiscall OpenMD::SelectionManager::beginSelectedBond(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppBVar2;
  int *in_RSI;
  long in_RDI;
  OpenMDBitSet *in_stack_ffffffffffffffe0;
  value_type pBVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RDI + 8),1);
  iVar1 = OpenMDBitSet::firstOnBit(in_stack_ffffffffffffffe0);
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pBVar3 = (value_type)0x0;
  }
  else {
    ppBVar2 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                        ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RDI + 0x50),
                         (long)*in_RSI);
    pBVar3 = *ppBVar2;
  }
  return pBVar3;
}

Assistant:

Bond* SelectionManager::beginSelectedBond(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].firstOnBit();
    return i == -1 ? NULL : bonds_[i];
#endif
  }